

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ConvertComplexPass.h
# Opt level: O3

void soul::ConvertComplexPass::run(Allocator *a,Namespace *m)

{
  ConvertComplexPass local_58;
  
  local_58.transformations.objects._M_h._M_buckets =
       &local_58.transformations.objects._M_h._M_single_bucket;
  local_58.transformations.objects._M_h._M_bucket_count = 1;
  local_58.transformations.objects._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_58.transformations.objects._M_h._M_element_count = 0;
  local_58.transformations.objects._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  local_58.transformations.objects._M_h._M_rehash_policy._M_next_resize = 0;
  local_58.transformations.objects._M_h._M_single_bucket = (__node_base_ptr)0x0;
  local_58.allocator = a;
  local_58.module = m;
  run(&local_58);
  std::
  _Hashtable<soul::AST::ASTObject_*,_std::pair<soul::AST::ASTObject_*const,_soul::AST::ASTObject_*>,_std::allocator<std::pair<soul::AST::ASTObject_*const,_soul::AST::ASTObject_*>_>,_std::__detail::_Select1st,_std::equal_to<soul::AST::ASTObject_*>,_std::hash<soul::AST::ASTObject_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<soul::AST::ASTObject_*,_std::pair<soul::AST::ASTObject_*const,_soul::AST::ASTObject_*>,_std::allocator<std::pair<soul::AST::ASTObject_*const,_soul::AST::ASTObject_*>_>,_std::__detail::_Select1st,_std::equal_to<soul::AST::ASTObject_*>,_std::hash<soul::AST::ASTObject_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)&local_58.transformations);
  return;
}

Assistant:

ConvertComplexPass (AST::Allocator& a, AST::Namespace& m) : allocator (a), module (m)
    {
    }